

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O3

void compute_gradient_info_sb(MACROBLOCK *x,BLOCK_SIZE sb_size,PLANE_TYPE plane)

{
  long lVar1;
  ushort *puVar2;
  PixelLevelGradientInfo *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  long *plVar10;
  long lVar11;
  long lVar12;
  ushort *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  undefined7 in_register_00000031;
  int iVar17;
  int iVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  ulong local_58;
  PixelLevelGradientInfo *grad_info_sb;
  
  iVar6 = (int)CONCAT71(in_register_00000011,plane);
  uVar21 = CONCAT71(in_register_00000011,plane) & 0xffffffff;
  uVar24 = iVar6 << 0x10;
  uVar20 = CONCAT71(in_register_00000031,sb_size) & 0xffffffff;
  uVar14 = (uint)(block_size_high[uVar20] >> ((byte)(x->e_mbd).plane[uVar21].subsampling_y & 0x1f));
  lVar22 = (ulong)(uint)(iVar6 << 7) + uVar21 * 8;
  plVar10 = (long *)((long)&x->plane[0].src.buf + lVar22);
  iVar6 = *(int *)((long)&x->plane[0].src.stride + lVar22);
  lVar22 = (long)iVar6;
  pPVar3 = x->pixel_gradient_info;
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    if (2 < uVar14) {
      uVar15 = (uint)(block_size_wide[uVar20] >>
                     ((byte)(x->e_mbd).plane[uVar21].subsampling_x & 0x1f));
      local_58 = 1;
      lVar23 = *plVar10;
      do {
        lVar1 = lVar23 + lVar22;
        if (2 < uVar15) {
          lVar25 = lVar23 + lVar22 + -1;
          lVar7 = local_58 * uVar15;
          uVar21 = (ulong)uVar24;
          uVar20 = 1;
          do {
            lVar12 = lVar25 + uVar20;
            lVar11 = lVar1 + uVar20 + 1;
            uVar9 = (uint)*(byte *)(lVar22 + lVar11);
            iVar16 = (uint)*(byte *)(-lVar22 + lVar11) + (uint)*(byte *)(lVar1 + 1 + uVar20) * 2 +
                     uVar9;
            uVar5 = (uint)*(byte *)(lVar22 + lVar12);
            iVar17 = (uint)*(byte *)(-lVar22 + lVar12) + (uint)*(byte *)(lVar25 + uVar20) * 2 +
                     uVar5;
            iVar6 = ((uVar9 + uVar5) -
                    ((uint)*(byte *)(lVar23 + 1 + uVar20) + (uint)*(byte *)(lVar23 + -1 + uVar20)))
                    + ((uint)*(byte *)(lVar1 + lVar22 + uVar20) - (uint)*(byte *)(lVar23 + uVar20))
                      * 2;
            iVar8 = iVar16 - iVar17;
            iVar4 = -iVar8;
            if (0 < iVar8) {
              iVar4 = iVar8;
            }
            iVar8 = -iVar6;
            if (0 < iVar6) {
              iVar8 = iVar6;
            }
            lVar12 = 0xff;
            iVar16 = iVar16 - iVar17;
            (&pPVar3[lVar7 + uVar20].is_dx_zero)[uVar21] = iVar16 == 0;
            *(short *)((long)&pPVar3[lVar7 + uVar20].abs_dx_abs_dy_sum + uVar21) =
                 (short)iVar8 + (short)iVar4;
            if (iVar16 != 0) {
              iVar16 = (iVar6 * 0x10000) / iVar16;
              if (iVar16 < -0x11a6e) {
                lVar11 = 8;
                lVar12 = 0;
              }
              else if (iVar16 < -0xc79) {
                lVar11 = 0x10;
                lVar12 = 8;
              }
              else {
                lVar11 = (ulong)(0xe821 < iVar16) * 8;
                lVar12 = lVar11 + 0x10;
                lVar11 = lVar11 + 0x18;
              }
              piVar19 = &get_hist_bin_idx_thresholds + lVar12;
              do {
                if (iVar16 <= *piVar19) goto LAB_001a3203;
                lVar12 = lVar12 + 1;
                piVar19 = piVar19 + 1;
              } while (lVar11 != lVar12);
              lVar12 = 0x1f;
            }
LAB_001a3203:
            (&pPVar3[lVar7 + uVar20].hist_bin_idx)[uVar21] = (int8_t)lVar12;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar15 - 1);
        }
        local_58 = local_58 + 1;
        lVar23 = lVar1;
      } while (local_58 != uVar14 - 1);
    }
  }
  else if (2 < uVar14) {
    uVar15 = (uint)(block_size_wide[uVar20] >> ((byte)(x->e_mbd).plane[uVar21].subsampling_x & 0x1f)
                   );
    iVar6 = -iVar6;
    local_58 = 1;
    lVar23 = *plVar10 * 2;
    do {
      lVar1 = lVar23 + lVar22 * 2;
      if (2 < uVar15) {
        lVar7 = local_58 * uVar15;
        uVar21 = (ulong)uVar24;
        uVar20 = 1;
        do {
          puVar2 = (ushort *)(lVar23 + lVar22 * 2 + -2 + uVar20 * 2);
          puVar13 = (ushort *)(lVar1 + uVar20 * 2 + 2);
          iVar8 = (uint)puVar13[iVar6] + (uint)*puVar13 * 2 + (uint)puVar13[lVar22];
          iVar18 = (uint)puVar2[iVar6] + (uint)*puVar2 * 2 + (uint)puVar2[lVar22];
          iVar4 = (((uint)puVar13[lVar22] + (uint)puVar2[lVar22]) -
                  ((uint)*(ushort *)(lVar23 + 2 + uVar20 * 2) +
                  (uint)*(ushort *)(lVar23 + -2 + uVar20 * 2))) +
                  ((uint)*(ushort *)(lVar1 + lVar22 * 2 + uVar20 * 2) -
                  (uint)*(ushort *)(lVar23 + uVar20 * 2)) * 2;
          iVar17 = iVar8 - iVar18;
          iVar16 = -iVar17;
          if (0 < iVar17) {
            iVar16 = iVar17;
          }
          iVar17 = -iVar4;
          if (0 < iVar4) {
            iVar17 = iVar4;
          }
          lVar25 = 0xff;
          iVar8 = iVar8 - iVar18;
          (&pPVar3[lVar7 + uVar20].is_dx_zero)[uVar21] = iVar8 == 0;
          *(short *)((long)&pPVar3[lVar7 + uVar20].abs_dx_abs_dy_sum + uVar21) =
               (short)iVar17 + (short)iVar16;
          if (iVar8 != 0) {
            iVar8 = (iVar4 * 0x10000) / iVar8;
            if (iVar8 < -0x11a6e) {
              lVar12 = 8;
              lVar25 = 0;
            }
            else if (iVar8 < -0xc79) {
              lVar12 = 0x10;
              lVar25 = 8;
            }
            else {
              lVar12 = (ulong)(0xe821 < iVar8) * 8;
              lVar25 = lVar12 + 0x10;
              lVar12 = lVar12 + 0x18;
            }
            piVar19 = &get_hist_bin_idx_thresholds + lVar25;
            do {
              if (iVar8 <= *piVar19) goto LAB_001a338b;
              lVar25 = lVar25 + 1;
              piVar19 = piVar19 + 1;
            } while (lVar12 != lVar25);
            lVar25 = 0x1f;
          }
LAB_001a338b:
          (&pPVar3[lVar7 + uVar20].hist_bin_idx)[uVar21] = (int8_t)lVar25;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar15 - 1);
      }
      local_58 = local_58 + 1;
      lVar23 = lVar1;
    } while (local_58 != uVar14 - 1);
  }
  return;
}

Assistant:

static inline void compute_gradient_info_sb(MACROBLOCK *const x,
                                            BLOCK_SIZE sb_size,
                                            PLANE_TYPE plane) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(&x->e_mbd)) {
    highbd_compute_gradient_info_sb(x, sb_size, plane);
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  lowbd_compute_gradient_info_sb(x, sb_size, plane);
}